

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

void amqp_ssl_socket_delete(void *base)

{
  void *in_RDI;
  amqp_ssl_socket_t *self;
  
  if (in_RDI != (void *)0x0) {
    amqp_ssl_socket_close(in_RDI,(amqp_socket_close_enum)((ulong)in_RDI >> 0x20));
    SSL_CTX_free(*(SSL_CTX **)((long)in_RDI + 8));
    free(in_RDI);
  }
  decrement_ssl_connections();
  return;
}

Assistant:

static void amqp_ssl_socket_delete(void *base) {
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;

  if (self) {
    amqp_ssl_socket_close(self, AMQP_SC_NONE);

    SSL_CTX_free(self->ctx);
    free(self);
  }
  decrement_ssl_connections();
}